

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_LBackward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64_t c;
  long lVar3;
  long lVar4;
  long lVar5;
  longdouble local_b0;
  longdouble local_a4;
  complex<long_double> __r;
  undefined4 local_78 [8];
  complex<long_double> local_58;
  
  lVar1 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar1 != CONCAT44(extraout_var,iVar2)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar1 = CONCAT44(extraout_var_00,iVar2);
  while (lVar4 = lVar1, 0 < lVar4) {
    lVar1 = lVar4 + -1;
    for (lVar3 = 0;
        lVar3 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
        lVar3 = lVar3 + 1) {
      iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      lVar5 = CONCAT44(extraout_var_01,iVar2);
      local_b0 = (longdouble)0;
      local_a4 = local_b0;
      while (lVar4 < lVar5) {
        lVar5 = lVar5 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_78,this,lVar1,lVar5);
        (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(&local_58,B,lVar5,lVar3);
        __r._M_value._16_4_ = local_78[4];
        __r._M_value._20_4_ = local_78[5];
        __r._M_value._24_2_ = SUB42(local_78[6],0);
        __r._M_value._26_2_ = SUB42((uint)local_78[6] >> 0x10,0);
        __r._M_value._28_4_ = local_78[7];
        __r._M_value._0_4_ = local_78[0];
        __r._M_value._4_4_ = local_78[1];
        __r._M_value._8_2_ = SUB42(local_78[2],0);
        __r._M_value._10_2_ = SUB42((uint)local_78[2] >> 0x10,0);
        __r._M_value._12_4_ = local_78[3];
        std::complex<long_double>::operator*=(&__r,&local_58);
        local_b0 = local_b0 +
                   (longdouble)
                   CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
        local_a4 = local_a4 +
                   (longdouble)
                   CONCAT28(__r._M_value._24_2_,CONCAT44(__r._M_value._20_4_,__r._M_value._16_4_));
      }
      (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(local_78,B,lVar1,lVar3);
      __r._M_value._8_2_ = SUB42(local_78[2],0);
      __r._M_value._10_2_ = SUB42((uint)local_78[2] >> 0x10,0);
      __r._M_value._12_4_ = local_78[3];
      __r._M_value._24_2_ = SUB42(local_78[6],0);
      __r._M_value._26_2_ = SUB42((uint)local_78[6] >> 0x10,0);
      __r._M_value._28_4_ = local_78[7];
      local_b0 = (longdouble)CONCAT28(__r._M_value._8_2_,CONCAT44(local_78[1],local_78[0])) -
                 local_b0;
      local_a4 = (longdouble)CONCAT28(__r._M_value._24_2_,CONCAT44(local_78[5],local_78[4])) -
                 local_a4;
      __r._M_value._0_4_ = SUB104(local_b0,0);
      __r._M_value._4_4_ = SUB104((unkuint10)local_b0 >> 0x20,0);
      __r._M_value._8_2_ = SUB102((unkuint10)local_b0 >> 0x40,0);
      __r._M_value._16_4_ = SUB104(local_a4,0);
      __r._M_value._20_4_ = SUB104((unkuint10)local_a4 >> 0x20,0);
      __r._M_value._24_2_ = SUB102((unkuint10)local_a4 >> 0x40,0);
      (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(B,lVar1,lVar3,&__r);
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}